

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O3

string * __thiscall
pfederc::TraitExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TraitExpr *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_pfederc::Capabilities_*,_false> caps;
  pointer puVar2;
  bool bVar3;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *impltrait;
  pointer puVar4;
  char cVar5;
  _List_node_base *p_Var6;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  caps._M_head_impl =
       (this->super_Capable).caps._M_t.
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  if (caps._M_head_impl != (Capabilities *)0x0) {
    _capsToString_abi_cxx11_(&local_50,caps._M_head_impl);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->templs).
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _templateToString_abi_cxx11_(&local_50,&this->templs);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  cVar5 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar5);
  (*this->tokId->_vptr_Token[2])(&local_50,this->tokId,(this->super_Expr).lexer);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((this->impltraits).
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->impltraits).
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar4 = (this->impltraits).
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->impltraits).
             super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar4 != puVar2) {
      bVar3 = true;
      do {
        if (!bVar3) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        (*((puVar4->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
           _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
           super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl)->_vptr_Expr[2])(&local_50);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        puVar4 = puVar4 + 1;
        bVar3 = false;
      } while (puVar4 != puVar2);
    }
  }
  std::__cxx11::string::push_back(cVar5);
  p_Var6 = (_List_node_base *)&this->functions;
  while (p_Var6 = (((_List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                     *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)&this->functions) {
    FuncExpr::toString_abi_cxx11_(&local_50,(FuncExpr *)p_Var6[1]._M_next);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back(cVar5);
  }
  std::__cxx11::string::push_back(cVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string TraitExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "trait";
  if (!templs.empty()) {
    result += _templateToString(templs);
  }

  result += ' ';
  result += getIdentifier().toString(getLexer());

  if (!impltraits.empty()) {
    result += ": ";
    bool first = true;
    for (auto &impltrait : impltraits) {
      if (!first)
        result += ", ";
      else
        first = false;

      result += impltrait->toString();
    }
  }

  result += '\n';
  for (auto &func : functions) {
    result += func->toString();
    result += '\n';
  }

  result += ';';

  return result;
}